

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_gl_engine.cpp
# Opt level: O2

vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
* __thiscall
polyscope::render::backend_openGL_mock::GLTextureBuffer::getDataVector2
          (vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
           *__return_storage_ptr__,GLTextureBuffer *this)

{
  int iVar1;
  allocator local_31;
  string local_30;
  
  iVar1 = dimension(&(this->super_TextureBuffer).format);
  if (iVar1 != 2) {
    std::__cxx11::string::string
              ((string *)&local_30,
               "called getDataVector2 on texture which does not have a 2 dimensional format",
               &local_31);
    exception(&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  (__return_storage_ptr__->
  super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
  ::resize(__return_storage_ptr__,
           (ulong)((this->super_TextureBuffer).sizeY * (this->super_TextureBuffer).sizeX));
  return __return_storage_ptr__;
}

Assistant:

std::vector<glm::vec2> GLTextureBuffer::getDataVector2() {
  if (dimension(format) != 2) exception("called getDataVector2 on texture which does not have a 2 dimensional format");

  std::vector<glm::vec2> outData;
  outData.resize(getSizeX() * getSizeY());

  return outData;
}